

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O2

String * __thiscall Tigre::String::aleatorio(String *__return_storage_ptr__,String *this,int len)

{
  undefined8 uVar1;
  long lVar2;
  String *this_00;
  int iVar3;
  undefined4 in_register_00000014;
  ulong uVar4;
  ulong uVar5;
  char *s;
  undefined8 uStack_50;
  char acStack_48 [8];
  String *local_40;
  undefined8 local_38;
  
  local_40 = __return_storage_ptr__;
  lVar2 = -((ulong)(len + 1) + 0xf & 0xfffffffffffffff0);
  s = acStack_48 + lVar2;
  uVar4 = 0;
  local_38 = CONCAT44(in_register_00000014,len);
  uVar5 = 0;
  if (0 < len) {
    uVar5 = (ulong)(uint)len;
  }
  *(undefined8 *)((long)&uStack_50 + lVar2) = 0x40;
  uVar1 = *(undefined8 *)((long)&uStack_50 + lVar2);
  for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
    *(undefined8 *)((long)&uStack_50 + lVar2) = 0x10793e;
    iVar3 = rand();
    s[uVar4] = (&DAT_00109840)[iVar3 % (int)uVar1];
  }
  s[(int)local_38] = '\0';
  this_00 = local_40;
  *(undefined8 *)((long)&uStack_50 + lVar2) = 0x107969;
  String(this_00,s);
  return this_00;
}

Assistant:

Tigre::String Tigre::String::aleatorio(int len) {
    char alfabeto[] = {
            '0', '1', '2', '3', '4', '5', '6', '7',
            '8', '9', 'A', 'B', 'C', 'D', 'E', 'F',
            'G', 'H', 'I', 'J', 'K', 'L', 'M', 'N',
            'O', 'P', 'Q', 'R', 'S', 'T', 'U', 'V',
            'W', 'X', 'Y', 'X', 'a', 'b', 'c', 'd',
            'e', 'f', 'g', 'h', 'i', 'j', 'k', 'l',
            'm', 'n', 'o', 'p', 'q', 'r', 's', 't',
            'u', 'v', 'w', 'x', 'y', 'z', '*', '#'
    };

    char palavra[len+1];

    for (int i = 0; i < len; i++) {
        palavra[i] = alfabeto[ rand() % 64 ]; /* 62 é o tamanho do alfabeto */
    }

    palavra[len] = '\0';

    return palavra;
}